

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_measurement * units::root(precise_measurement *pm,int power)

{
  precise_measurement *in_RSI;
  precise_measurement *in_RDI;
  double val;
  precise_unit pVar1;
  undefined8 in_stack_ffffffffffffffc0;
  precise_measurement *value;
  precise_unit local_20;
  precise_measurement *local_8;
  
  value = in_RDI;
  local_8 = in_RSI;
  precise_measurement::value(in_RSI);
  val = numericalRoot<double>((double)value,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  pVar1 = precise_measurement::units(local_8);
  pVar1 = root((precise_unit *)pVar1.multiplier_,(int)((ulong)value >> 0x20));
  local_20._8_8_ = pVar1._8_8_;
  local_20.multiplier_ = pVar1.multiplier_;
  precise_measurement::precise_measurement(in_RDI,val,&local_20);
  return value;
}

Assistant:

precise_measurement root(const precise_measurement& pm, int power)
{
    return {numericalRoot(pm.value(), power), root(pm.units(), power)};
}